

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O3

bool __thiscall
XPMP2::SoundSystemFMOD::LoadSoundFile
          (SoundSystemFMOD *this,string *_sndName,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  SoundFile *pSVar1;
  SoundFMOD *this_00;
  mapped_type *pmVar2;
  char *pcVar3;
  
  this_00 = (SoundFMOD *)operator_new(0x58);
  SoundFMOD::SoundFMOD
            (this_00,this,_filePath,_bLoop,_coneDir,_conePitch,_coneInAngle,_coneOutAngle,
             _coneOutVol);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
           ::operator[](&(this->super_SoundSystem).mapSounds,_sndName);
  pSVar1 = (pmVar2->_M_t).
           super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>._M_t.
           super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
           super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl;
  (pmVar2->_M_t).super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>.
  _M_t.super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
  super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl = (SoundFile *)this_00;
  if (pSVar1 != (SoundFile *)0x0) {
    (*pSVar1->_vptr_SoundFile[1])();
  }
  if (glob < 1) {
    pcVar3 = " ";
    if (_bLoop) {
      pcVar3 = " looping ";
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
           ,0xf1,"LoadSoundFile",logDEBUG,"Added%ssound \'%s\' from file \'%s\'",pcVar3,
           (_sndName->_M_dataplus)._M_p,(_filePath->_M_dataplus)._M_p);
  }
  return true;
}

Assistant:

bool SoundSystemFMOD::LoadSoundFile (const std::string& _sndName,
                                     const std::string& _filePath, bool _bLoop,
                                     float _coneDir, float _conePitch,
                                     float _coneInAngle,
                                     float _coneOutAngle, float _coneOutVol)
{
    try {
        // Create the sound file object, loading the file into memory
        SoundFilePtr p = std::make_unique<SoundFMOD>(this, _filePath, _bLoop,
                                                     _coneDir, _conePitch,
                                                     _coneInAngle,
                                                     _coneOutAngle, _coneOutVol);
        // Have the sound file object managed by our map of sounds
        mapSounds[_sndName] = std::move(p);
        LOG_MSG(logDEBUG, "Added%ssound '%s' from file '%s'",
                _bLoop ? " looping " : " ", _sndName.c_str(), _filePath.c_str());
        return true;
    }
    catch (const std::runtime_error& e) {
        LOG_MSG(logERR, "Could not load sound '%s' from file '%s': %s",
                _sndName.c_str(), _filePath.c_str(), e.what());
    }
    catch (...) {
        LOG_MSG(logERR, "Could not load sound '%s' from file '%s'",
                _sndName.c_str(), _filePath.c_str());
    }
    return false;
}